

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinystr.cpp
# Opt level: O0

TiXmlString * __thiscall
despot::util::tinyxml::TiXmlString::assign(TiXmlString *this,char *str,size_type len)

{
  char *pcVar1;
  TiXmlString local_30;
  TiXmlString tmp;
  size_type cap;
  size_type len_local;
  char *str_local;
  TiXmlString *this_local;
  
  tmp.rep_ = (Rep *)capacity(this);
  if ((tmp.rep_ < len) || ((Rep *)((len + 8) * 3) < tmp.rep_)) {
    TiXmlString(&local_30);
    init(&local_30,(EVP_PKEY_CTX *)len);
    pcVar1 = start(&local_30);
    memcpy(pcVar1,str,len);
    swap(this,&local_30);
    ~TiXmlString(&local_30);
  }
  else {
    pcVar1 = start(this);
    memmove(pcVar1,str,len);
    set_size(this,len);
  }
  return this;
}

Assistant:

TiXmlString& TiXmlString::assign(const char* str, size_type len) {
	size_type cap = capacity();
	if (len > cap || cap > 3 * (len + 8)) {
		TiXmlString tmp;
		tmp.init(len);
		memcpy(tmp.start(), str, len);
		swap(tmp);
	} else {
		memmove(start(), str, len);
		set_size(len);
	}
	return *this;
}